

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O2

String * __thiscall
Rml::Property::ToString_abi_cxx11_(String *__return_storage_ptr__,Property *this)

{
  PropertyDefinition *this_00;
  String local_90;
  String local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = this->definition;
  if (this_00 == (PropertyDefinition *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    Variant::Get<std::__cxx11::string>(&local_30,&this->value,&local_50);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    ToString<Rml::Unit>(&local_70,&this->unit,&local_90);
    ::std::operator+(__return_storage_ptr__,&local_30,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_30);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    PropertyDefinition::GetValue(this_00,__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

String Property::ToString() const
{
	if (!definition)
		return value.Get<String>() + Rml::ToString(unit);

	String string;
	definition->GetValue(string, *this);
	return string;
}